

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollfd.c
# Opt level: O1

void lws_accept_modulation(lws_context *context,lws_context_per_thread *pt,int allow)

{
  lws_dll2 *plVar1;
  lws_vhost *plVar2;
  bool bVar3;
  lws_pollargs pa1;
  lws_pollargs local_34;
  
  plVar2 = context->vhost_list;
  if (plVar2 != (lws_vhost *)0x0) {
    bVar3 = (int)pt == 0;
    do {
      for (plVar1 = (plVar2->listen_wsi).head; plVar1 != (lws_dll2 *)0x0; plVar1 = plVar1->next) {
        _lws_change_pollfd((lws *)&plVar1[-0x1b].next,(uint)bVar3,(uint)!bVar3,&local_34);
      }
      plVar2 = plVar2->vhost_next;
    } while (plVar2 != (lws_vhost *)0x0);
  }
  return;
}

Assistant:

static void
lws_accept_modulation(struct lws_context *context,
		      struct lws_context_per_thread *pt, int allow)
{
	struct lws_vhost *vh = context->vhost_list;
	struct lws_pollargs pa1;

	while (vh) {
		lws_start_foreach_dll(struct lws_dll2 *, d,
				      lws_dll2_get_head(&vh->listen_wsi)) {
			struct lws *wsi = lws_container_of(d, struct lws,
							   listen_list);

			_lws_change_pollfd(wsi, allow ? 0 : LWS_POLLIN,
						allow ? LWS_POLLIN : 0, &pa1);
		} lws_end_foreach_dll(d);

		vh = vh->vhost_next;
	}
}